

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_view_unittest.cpp
# Opt level: O2

void __thiscall array_view_const_view_Test::TestBody(array_view_const_view_Test *this)

{
  pointer pvVar1;
  size_type sVar2;
  long lVar3;
  reference pvVar4;
  const_reference pvVar5;
  long lVar6;
  iterator __end1;
  char *pcVar7;
  size_type i_1;
  size_type sVar8;
  iterator __begin1;
  size_type i;
  AssertionResult gtest_ar;
  AssertHelper local_78;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  vector v;
  const_view v_const;
  
  memory::
  Array<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>::
  Array<int,void>((Array<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
                   *)&v,10);
  sVar8 = v.super_ArrayView<int,_memory::HostCoordinator<int>_>.size_;
  pvVar1 = v.super_ArrayView<int,_memory::HostCoordinator<int>_>.pointer_;
  lVar6 = 0;
  for (lVar3 = v.super_ArrayView<int,_memory::HostCoordinator<int>_>.size_ * 4; lVar3 != 0;
      lVar3 = lVar3 + -4) {
    v.super_ArrayView<int,_memory::HostCoordinator<int>_>.pointer_[lVar6] =
         (value_type_conflict1)lVar6;
    lVar6 = lVar6 + 1;
  }
  v_const.pointer_ = v.super_ArrayView<int,_memory::HostCoordinator<int>_>.pointer_;
  v_const.size_ = v.super_ArrayView<int,_memory::HostCoordinator<int>_>.size_;
  for (i = 0; sVar2 = v.super_ArrayView<int,_memory::HostCoordinator<int>_>.size_, sVar8 != i;
      i = i + 1) {
    pvVar4 = memory::
             ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
             ::operator[](&v.super_ArrayView<int,_memory::HostCoordinator<int>_>,i);
    pvVar5 = memory::
             ConstArrayViewImpl<memory::ConstArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
             ::operator[](&v_const,i);
    testing::internal::CmpHelperEQ<int,int>((internal *)&gtest_ar,"v[i]","v_const[i]",pvVar4,pvVar5)
    ;
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_70);
      pcVar7 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_view_unittest.cpp"
                 ,0x15,pcVar7);
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_70);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  v_const.pointer_ = pvVar1;
  v_const.size_ = sVar8;
  for (sVar8 = 0; sVar2 != sVar8; sVar8 = sVar8 + 1) {
    pvVar4 = memory::
             ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
             ::operator[](&v.super_ArrayView<int,_memory::HostCoordinator<int>_>,sVar8);
    pvVar5 = memory::
             ConstArrayViewImpl<memory::ConstArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
             ::operator[](&v_const,sVar8);
    testing::internal::CmpHelperEQ<int,int>((internal *)&gtest_ar,"v[i]","v_const[i]",pvVar4,pvVar5)
    ;
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_70);
      pcVar7 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_view_unittest.cpp"
                 ,0x1b,pcVar7);
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_70);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  v_const.pointer_ = v.super_ArrayView<int,_memory::HostCoordinator<int>_>.pointer_;
  v_const.size_ = v.super_ArrayView<int,_memory::HostCoordinator<int>_>.size_;
  for (sVar8 = 0; v.super_ArrayView<int,_memory::HostCoordinator<int>_>.size_ != sVar8;
      sVar8 = sVar8 + 1) {
    pvVar4 = memory::
             ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
             ::operator[](&v.super_ArrayView<int,_memory::HostCoordinator<int>_>,sVar8);
    pvVar5 = memory::
             ConstArrayViewImpl<memory::ConstArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
             ::operator[](&v_const,sVar8);
    testing::internal::CmpHelperEQ<int,int>((internal *)&gtest_ar,"v[i]","v_const[i]",pvVar4,pvVar5)
    ;
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_70);
      pcVar7 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_view_unittest.cpp"
                 ,0x21,pcVar7);
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_70);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  memory::
  Array<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::~Array(&v);
  return;
}

Assistant:

TEST(array_view, const_view) {
    using vector = memory::HostVector<int>;
    using view   = vector::view_type;
    using const_view  = vector::const_view_type;

    vector v(10);
    std::iota(v.begin(), v.end(), 0);

    view v_non_const = v;

    {
        const_view v_const(v);
        for(auto i : v.range()) {
            EXPECT_EQ(v[i], v_const[i]);
        }
    }
    {
        const_view v_const(v_non_const);
        for(auto i : v.range()) {
            EXPECT_EQ(v[i], v_const[i]);
        }
    }
    {
        const_view v_const(v(memory::all));
        for(auto i : v.range()) {
            EXPECT_EQ(v[i], v_const[i]);
        }
    }
}